

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void __thiscall
xLearn::ReaderTest_SampleFromDisk_Test::TestBody(ReaderTest_SampleFromDisk_Test *this)

{
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  
  std::operator+(&lr_file,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          kTestfilename_abi_cxx11_,"_LR.txt");
  std::operator+(&ffm_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm.txt");
  std::operator+(&csv_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv.txt");
  std::operator+(&lr_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_comma.txt");
  std::operator+(&ffm_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_comma.txt");
  std::operator+(&csv_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv_comma.txt");
  std::operator+(&lr_no_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no.txt");
  std::operator+(&ffm_no_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no.txt");
  std::operator+(&lr_no_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no_comma.txt");
  std::operator+(&ffm_no_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no_comma.txt");
  read_from_disk(&lr_file,0);
  puts("check lr");
  read_from_disk(&ffm_file,1);
  puts("check ffm");
  read_from_disk(&csv_file,2);
  puts("check csv");
  read_from_disk(&lr_no_file,3);
  puts("check lr");
  read_from_disk(&ffm_no_file,4);
  puts("check ffm");
  read_from_disk(&lr_file_comma,0);
  puts("check lr");
  read_from_disk(&ffm_file_comma,1);
  puts("check ffm");
  read_from_disk(&csv_file_comma,2);
  puts("check csv");
  read_from_disk(&lr_no_file_comma,3);
  puts("check lr");
  read_from_disk(&ffm_no_file_comma,4);
  puts("check ffm");
  delete_file();
  std::__cxx11::string::~string((string *)&ffm_no_file_comma);
  std::__cxx11::string::~string((string *)&lr_no_file_comma);
  std::__cxx11::string::~string((string *)&ffm_no_file);
  std::__cxx11::string::~string((string *)&lr_no_file);
  std::__cxx11::string::~string((string *)&csv_file_comma);
  std::__cxx11::string::~string((string *)&ffm_file_comma);
  std::__cxx11::string::~string((string *)&lr_file_comma);
  std::__cxx11::string::~string((string *)&csv_file);
  std::__cxx11::string::~string((string *)&ffm_file);
  std::__cxx11::string::~string((string *)&lr_file);
  return;
}

Assistant:

TEST(ReaderTest, SampleFromDisk) { 
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_disk(lr_file, 0);
  printf("check lr\n");
  read_from_disk(ffm_file, 1);
  printf("check ffm\n");
  read_from_disk(csv_file, 2);
  printf("check csv\n");
  read_from_disk(lr_no_file, 3);
  printf("check lr\n");
  read_from_disk(ffm_no_file, 4);
  printf("check ffm\n");
  read_from_disk(lr_file_comma, 0);
  printf("check lr\n");
  read_from_disk(ffm_file_comma, 1);
  printf("check ffm\n");
  read_from_disk(csv_file_comma, 2);
  printf("check csv\n");
  read_from_disk(lr_no_file_comma, 3);
  printf("check lr\n");
  read_from_disk(ffm_no_file_comma, 4);
  printf("check ffm\n");
  // delete file
  delete_file();
}